

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

refs_t * refs_load_fai(refs_t *r_orig,char *fn,int is_err)

{
  ref_entry *__ptr;
  uint uVar1;
  bool bVar2;
  int iVar3;
  khint_t kVar4;
  int iVar5;
  size_t sVar6;
  refs_t *r;
  char *pcVar7;
  BGZF *pBVar8;
  ref_entry *__ptr_00;
  ushort **ppuVar9;
  longlong lVar10;
  long lVar11;
  ref_entry **pprVar12;
  char *pcVar13;
  char cVar14;
  int n;
  stat sb;
  char fai_fn [4096];
  char line [8192];
  char *local_30e8;
  int local_30dc;
  ulong local_30d8;
  FILE *local_30d0;
  stat local_30c8;
  char local_3038 [4096];
  char local_2038;
  char local_2037 [8199];
  
  sVar6 = strlen(fn);
  r = r_orig;
  if ((r_orig == (refs_t *)0x0) && (r = refs_create(), r == (refs_t *)0x0)) {
    r = (refs_t *)0x0;
    goto LAB_0012fbe4;
  }
  iVar3 = stat(fn,&local_30c8);
  if (iVar3 == 0) {
    if ((r->fp != (BGZF *)0x0) && (iVar3 = bgzf_close(r->fp), iVar3 != 0)) goto LAB_0012fbe4;
    r->fp = (BGZF *)0x0;
    pcVar13 = fn;
    pcVar7 = string_dup(r->pool,fn);
    r->fn = pcVar7;
    if (pcVar7 == (char *)0x0) goto LAB_0012fbe4;
    if (4 < sVar6) {
      pcVar13 = ".fai";
      iVar3 = strcmp(fn + (sVar6 - 4),".fai");
      if (iVar3 == 0) {
        pcVar7[sVar6 - 4] = '\0';
      }
    }
    pBVar8 = bgzf_open_ref(r->fn,pcVar13);
    r->fp = pBVar8;
    if (pBVar8 == (BGZF *)0x0) goto LAB_0012fbe4;
    sprintf(local_3038,"%.*s.fai",0xffb,r->fn);
    iVar3 = stat(local_3038,&local_30c8);
    if ((iVar3 == 0) && (local_30d0 = fopen(local_3038,"r"), local_30d0 != (FILE *)0x0)) {
      iVar3 = 0;
      local_30d8 = 0;
      do {
        pcVar13 = fgets(&local_2038,0x2000,local_30d0);
        if (pcVar13 == (char *)0x0) {
          return r;
        }
        __ptr_00 = (ref_entry *)malloc(0x38);
        cVar14 = local_2038;
        if (__ptr_00 == (ref_entry *)0x0) {
LAB_0012fe03:
          bVar2 = false;
        }
        else {
          pcVar13 = &local_2038;
          if (local_2038 != '\0') {
            ppuVar9 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) != 0) break;
              cVar14 = pcVar13[1];
              pcVar13 = pcVar13 + 1;
            } while (cVar14 != '\0');
          }
          local_30e8 = pcVar13 + 1;
          *pcVar13 = '\0';
          pcVar7 = string_dup(r->pool,&local_2038);
          pcVar13 = local_30e8;
          __ptr_00->name = pcVar7;
          cVar14 = *local_30e8;
          if (cVar14 != '\0') {
            ppuVar9 = __ctype_b_loc();
            local_30e8 = pcVar13;
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) == 0) break;
              cVar14 = local_30e8[1];
              local_30e8 = local_30e8 + 1;
            } while (cVar14 != '\0');
          }
          lVar10 = strtoll(local_30e8,&local_30e8,10);
          pcVar13 = local_30e8;
          __ptr_00->length = lVar10;
          cVar14 = *local_30e8;
          if (cVar14 != '\0') {
            ppuVar9 = __ctype_b_loc();
            local_30e8 = pcVar13;
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) == 0) break;
              cVar14 = local_30e8[1];
              local_30e8 = local_30e8 + 1;
            } while (cVar14 != '\0');
          }
          lVar10 = strtoll(local_30e8,&local_30e8,10);
          pcVar13 = local_30e8;
          __ptr_00->offset = lVar10;
          cVar14 = *local_30e8;
          if (cVar14 != '\0') {
            ppuVar9 = __ctype_b_loc();
            local_30e8 = pcVar13;
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) == 0) break;
              cVar14 = local_30e8[1];
              local_30e8 = local_30e8 + 1;
            } while (cVar14 != '\0');
          }
          lVar11 = strtol(local_30e8,&local_30e8,10);
          pcVar13 = local_30e8;
          __ptr_00->bases_per_line = (int)lVar11;
          cVar14 = *local_30e8;
          if (cVar14 != '\0') {
            ppuVar9 = __ctype_b_loc();
            local_30e8 = pcVar13;
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) == 0) break;
              cVar14 = local_30e8[1];
              local_30e8 = local_30e8 + 1;
            } while (cVar14 != '\0');
          }
          lVar11 = strtol(local_30e8,&local_30e8,10);
          __ptr_00->line_length = (int)lVar11;
          __ptr_00->fn = r->fn;
          __ptr_00->count = 0;
          __ptr_00->seq = (char *)0x0;
          kVar4 = kh_put_refs(r->h_meta,__ptr_00->name,&local_30dc);
          if (local_30dc == 0) {
            __ptr = r->h_meta->vals[kVar4];
            if (__ptr != (ref_entry *)0x0) {
              if ((__ptr->count != 0) || (__ptr->length != 0)) {
                free(__ptr_00);
                goto LAB_0012fe5f;
              }
              free(__ptr);
            }
            r->h_meta->vals[kVar4] = __ptr_00;
          }
          else {
            if (local_30dc == -1) {
              free(__ptr_00);
              goto LAB_0012fe03;
            }
            r->h_meta->vals[kVar4] = __ptr_00;
          }
LAB_0012fe5f:
          iVar5 = (int)local_30d8;
          if (iVar5 <= iVar3) {
            uVar1 = iVar5 * 2;
            if (iVar5 == 0) {
              uVar1 = 0x10;
            }
            local_30d8 = (ulong)uVar1;
            pprVar12 = (ref_entry **)realloc(r->ref_id,(long)(int)uVar1 * 8);
            r->ref_id = pprVar12;
            if (iVar3 < (int)uVar1) {
              lVar11 = (long)iVar3;
              do {
                r->ref_id[lVar11] = (ref_entry *)0x0;
                lVar11 = lVar11 + 1;
              } while ((int)uVar1 != lVar11);
            }
          }
          r->ref_id[iVar3] = __ptr_00;
          iVar3 = iVar3 + 1;
          r->nref = iVar3;
          bVar2 = true;
        }
        if (!bVar2) {
          return (refs_t *)0x0;
        }
      } while( true );
    }
    if (is_err == 0) goto LAB_0012fbe4;
    fn = local_3038;
  }
  else if (is_err == 0) goto LAB_0012fbe4;
  perror(fn);
LAB_0012fbe4:
  if (r_orig == (refs_t *)0x0) {
    refs_free(r);
  }
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_load_fai(refs_t *r_orig, char *fn, int is_err) {
    struct stat sb;
    FILE *fp = NULL;
    char fai_fn[PATH_MAX];
    char line[8192];
    refs_t *r = r_orig;
    size_t fn_l = strlen(fn);
    int id = 0, id_alloc = 0;

    RP("refs_load_fai %s\n", fn);

    if (!r)
	if (!(r = refs_create()))
	    goto err;

    /* Open reference, for later use */
    if (stat(fn, &sb) != 0) {
	if (is_err)
	    perror(fn);
	goto err;
    }

    if (r->fp)
	if (bgzf_close(r->fp) != 0)
	    goto err;
    r->fp = NULL;

    if (!(r->fn = string_dup(r->pool, fn)))
	goto err;
	
    if (fn_l > 4 && strcmp(&fn[fn_l-4], ".fai") == 0)
	r->fn[fn_l-4] = 0;

    if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	goto err;

    /* Parse .fai file and load meta-data */
    sprintf(fai_fn, "%.*s.fai", PATH_MAX-5, r->fn);

    if (stat(fai_fn, &sb) != 0) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    if (!(fp = fopen(fai_fn, "r"))) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    while (fgets(line, 8192, fp) != NULL) {
	ref_entry *e = malloc(sizeof(*e));
	char *cp;
	int n;
	khint_t k;

	if (!e)
	    return NULL;

	// id
	for (cp = line; *cp && !isspace(*cp); cp++)
	    ;
	*cp++ = 0;
	e->name = string_dup(r->pool, line);
	
	// length
	while (*cp && isspace(*cp))
	    cp++;
	e->length = strtoll(cp, &cp, 10);

	// offset
	while (*cp && isspace(*cp))
	    cp++;
	e->offset = strtoll(cp, &cp, 10);

	// bases per line
	while (*cp && isspace(*cp))
	    cp++;
	e->bases_per_line = strtol(cp, &cp, 10);

	// line length
	while (*cp && isspace(*cp))
	    cp++;
	e->line_length = strtol(cp, &cp, 10);

	// filename
	e->fn = r->fn;

	e->count = 0;
	e->seq = NULL;

	k = kh_put(refs, r->h_meta, e->name, &n);
	if (-1 == n)  {
	    free(e);
	    return NULL;
	}

	if (n) {
	    kh_val(r->h_meta, k) = e;
	} else {
	    ref_entry *re = kh_val(r->h_meta, k);
	    if (re && (re->count != 0 || re->length != 0)) {
		/* Keep old */
		free(e);
	    } else {
		/* Replace old */
		if (re)
		    free(re);
		kh_val(r->h_meta, k) = e;
	    }
	}

	if (id >= id_alloc) {
	    int x;

	    id_alloc = id_alloc ?id_alloc*2 : 16;
	    r->ref_id = realloc(r->ref_id, id_alloc * sizeof(*r->ref_id));

	    for (x = id; x < id_alloc; x++)
		r->ref_id[x] = NULL;
	}
	r->ref_id[id] = e;
	r->nref = ++id;
    }

    return r;

 err:
    if (fp)
	fclose(fp);

    if (!r_orig)
	refs_free(r);
    
    return NULL;
}